

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeTuple<unsigned_int,2ul>
          (AsciiParser *this,array<unsigned_int,_2UL> *result)

{
  bool bVar1;
  size_t i;
  long lVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string msg;
  
  bVar1 = Expect(this,'(');
  if (!bVar1) {
    return false;
  }
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = SepBy1BasicType<unsigned_int>(this,',',&values);
  if ((bVar1) && (bVar1 = Expect(this,')'), bVar1)) {
    if ((long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
        result->_M_elems[lVar2] =
             values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar2];
      }
      bVar1 = true;
      goto LAB_002c6c55;
    }
    std::__cxx11::to_string(&local_f0,2);
    ::std::operator+(&local_b0,"The number of tuple elements must be ",&local_f0);
    ::std::operator+(&local_90,&local_b0,", but got ");
    std::__cxx11::to_string
              (&local_d0,
               (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    ::std::operator+(&local_70,&local_90,&local_d0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     &local_70,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    PushError(this,&msg);
    ::std::__cxx11::string::_M_dispose();
  }
  bVar1 = false;
LAB_002c6c55:
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return bVar1;
}

Assistant:

bool AsciiParser::ParseBasicTypeTuple(std::array<T, N> *result) {
  if (!Expect('(')) {
    return false;
  }

  std::vector<T> values;
  if (!SepBy1BasicType<T>(',', &values)) {
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  if (values.size() != N) {
    std::string msg = "The number of tuple elements must be " +
                      std::to_string(N) + ", but got " +
                      std::to_string(values.size()) + "\n";
    PushError(msg);
    return false;
  }

  for (size_t i = 0; i < N; i++) {
    (*result)[i] = values[i];
  }

  return true;
}